

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.h
# Opt level: O1

void __thiscall Player::~Player(Player *this)

{
  pointer pCVar1;
  pointer pcVar2;
  
  this->_vptr_Player = (_func_int **)&PTR_nextRound_0010eb00;
  pCVar1 = (this->m_cards).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pCVar1 != (pointer)0x0) {
    operator_delete(pCVar1);
  }
  pcVar2 = (this->m_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_name).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

Player(std::string name = "noName") : m_name(name) {}